

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BracketInsert_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BracketInsert_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  value_type vVar3;
  char *pcVar4;
  AssertHelper *this_00;
  long in_RDI;
  Hasher HVar5;
  Hasher HVar6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  int line;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  size_type in_stack_fffffffffffffaf8;
  Type type;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  key_type *in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  char *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  uint i;
  char *in_stack_fffffffffffffb40;
  AssertionResult *in_stack_fffffffffffffb48;
  Message *message;
  AssertHelper *in_stack_fffffffffffffb50;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_01;
  Hasher local_418;
  int local_408;
  undefined4 local_404;
  AssertionResult local_400;
  value_type local_3ec;
  undefined1 local_3e5;
  key_type local_3e4;
  Hasher local_3d0;
  Hasher local_3c0;
  int local_3b0;
  undefined4 local_3ac;
  AssertionResult local_3a8;
  value_type local_394;
  undefined1 local_38d;
  key_type local_38c;
  Hasher local_378;
  Hasher local_368;
  int local_358;
  undefined4 local_354;
  AssertionResult local_350;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_340;
  Message local_330 [3];
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_318;
  string local_298 [48];
  value_type local_268;
  undefined1 local_261;
  key_type local_260;
  undefined1 local_259;
  AssertionResult local_258;
  string local_248 [48];
  value_type local_218;
  undefined1 local_211;
  key_type local_210;
  undefined1 local_209;
  AssertionResult local_208;
  value_type local_1f4;
  undefined1 local_1ed;
  key_type local_1ec;
  string local_1e8 [48];
  value_type local_1b8;
  undefined1 local_1b1;
  key_type local_1b0;
  undefined1 local_1a9;
  AssertionResult local_1a8;
  string local_198 [48];
  const_iterator local_168;
  key_type local_144;
  dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_140;
  undefined1 local_119;
  AssertionResult local_118;
  value_type local_104;
  undefined1 local_fd;
  key_type local_fc;
  string local_f8 [48];
  const_iterator local_c8;
  key_type local_a4;
  dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a0;
  undefined1 local_79;
  AssertionResult local_78;
  string local_68 [71];
  undefined1 local_21;
  key_type local_20;
  undefined1 local_19;
  AssertionResult local_18;
  
  bVar1 = google::
          HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_brackets((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)(in_RDI + 0x10));
  if (bVar1) {
    local_20 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_21 = google::
               HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::default_data((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)(in_RDI + 0x10));
    local_19 = google::
               HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::bracket_equal<bool>
                         ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                           *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                          in_stack_fffffffffffffb08,
                          (bool *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffad0,
               (bool *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (type *)0xdde552);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                 (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (Type)(in_stack_fffffffffffffaf8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 in_stack_fffffffffffffaec,(char *)in_stack_fffffffffffffae0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      std::__cxx11::string::~string(local_68);
      testing::Message::~Message((Message *)0xdde613);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xdde6aa);
    local_a4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
           in_stack_fffffffffffffb08);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::end((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
    local_79 = google::
               dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=(&local_a0,&local_c8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffad0,
               (bool *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (type *)0xdde73f);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                 (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (Type)(in_stack_fffffffffffffaf8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 in_stack_fffffffffffffaec,(char *)in_stack_fffffffffffffae0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      std::__cxx11::string::~string(local_f8);
      testing::Message::~Message((Message *)0xdde812);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xdde8a9);
    local_fc = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_104 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_fd = google::
               HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::get_data((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                           *)(in_RDI + 0x10),&local_104);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (key_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (bool *)in_stack_fffffffffffffae0);
    local_144 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
           in_stack_fffffffffffffb08);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::end((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
    local_119 = google::
                dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::operator!=(&local_140,&local_168);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffad0,
               (bool *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (type *)0xdde9c9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                 (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (Type)(in_stack_fffffffffffffaf8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 in_stack_fffffffffffffaec,(char *)in_stack_fffffffffffffae0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      std::__cxx11::string::~string(local_198);
      testing::Message::~Message((Message *)0xddea9c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xddeb33);
    local_1b0 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_1b8 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_1b1 = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_1b8);
    local_1a9 = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::bracket_equal<bool>
                          ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb08,
                           (bool *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffad0,
               (bool *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (type *)0xddebe0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                 (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (Type)(in_stack_fffffffffffffaf8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 in_stack_fffffffffffffaec,(char *)in_stack_fffffffffffffae0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      std::__cxx11::string::~string(local_1e8);
      testing::Message::~Message((Message *)0xddecb3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xdded4a);
    local_1ec = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_1f4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_1ed = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_1f4);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (key_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (bool *)in_stack_fffffffffffffae0);
    local_210 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_218 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_211 = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_218);
    local_209 = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::bracket_equal<bool>
                          ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb08,
                           (bool *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffad0,
               (bool *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (type *)0xddee82);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                 (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (Type)(in_stack_fffffffffffffaf8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 in_stack_fffffffffffffaec,(char *)in_stack_fffffffffffffae0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      std::__cxx11::string::~string(local_248);
      testing::Message::~Message((Message *)0xddef55);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xddefec);
    local_260 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_268 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_261 = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_268);
    local_259 = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::bracket_equal<bool>
                          ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb08,
                           (bool *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffad0,
               (bool *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (type *)0xddf099);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                 (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (Type)(in_stack_fffffffffffffaf8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 in_stack_fffffffffffffaec,(char *)in_stack_fffffffffffffae0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      std::__cxx11::string::~string(local_298);
      testing::Message::~Message((Message *)0xddf16c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xddf203);
    i = 0;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    message = local_330;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    this_01 = &local_340;
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_01,i,(int *)(ulong)i);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashSet
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,
               (hasher *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (key_equal *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (allocator_type *)in_stack_fffffffffffffae0);
    type = (Type)(in_stack_fffffffffffffaf8 >> 0x20);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_340);
    local_354 = 0;
    local_378 = (Hasher)google::
                        BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        ::hash_funct(in_stack_fffffffffffffae0);
    local_368 = local_378;
    local_358 = Hasher::num_hashes(&local_368);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)in_stack_fffffffffffffae0,
               (int *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (int *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      testing::AssertionResult::failure_message((AssertionResult *)0xddf3a4);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),type,
                 (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 in_stack_fffffffffffffaec,(char *)in_stack_fffffffffffffae0);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_01,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      testing::Message::~Message((Message *)0xddf401);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xddf472);
    local_38c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_394 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_38d = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data(&local_318,&local_394);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (key_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (bool *)in_stack_fffffffffffffae0);
    local_3ac = 1;
    HVar5 = (Hasher)google::
                    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ::hash_funct(in_stack_fffffffffffffae0);
    local_3d0 = HVar5;
    local_3c0 = HVar5;
    local_3b0 = Hasher::num_hashes(&local_3c0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)in_stack_fffffffffffffae0,
               (int *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (int *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(HVar5.num_compares_,in_stack_fffffffffffffb00));
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0xddf5df);
      type = (Type)((ulong)pcVar4 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(HVar5.num_compares_,in_stack_fffffffffffffb00),type,
                 (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 in_stack_fffffffffffffaec,(char *)in_stack_fffffffffffffae0);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_01,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      testing::Message::~Message((Message *)0xddf63c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xddf6ad);
    kVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_3e4 = kVar2;
    vVar3 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    local_3ec = vVar3;
    local_3e5 = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data(&local_318,&local_3ec);
    line = CONCAT13(local_3e5,(int3)in_stack_fffffffffffffaec);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(kVar2,vVar3),(key_type *)CONCAT44(line,in_stack_fffffffffffffae8),
               (bool *)in_stack_fffffffffffffae0);
    local_404 = 2;
    HVar6 = (Hasher)google::
                    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ::hash_funct(in_stack_fffffffffffffae0);
    local_418 = HVar6;
    local_408 = Hasher::num_hashes(&local_418);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(line,in_stack_fffffffffffffae8),HVar6._0_8_,
               (int *)CONCAT44(HVar6.num_compares_,in_stack_fffffffffffffad8),
               (int *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(HVar5.num_compares_,in_stack_fffffffffffffb00));
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0xddf81a);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(HVar5.num_compares_,in_stack_fffffffffffffb00),type,
                 (char *)CONCAT44(kVar2,vVar3),line,HVar6._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_01,message);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0xddf877);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xddf8e2);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashSet
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xddf8ef);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BracketInsert) {
  // tests operator[], for those types that support it.
  if (!this->ht_.supports_brackets()) return;

  // bracket_equal is equivalent to ht_[a] == b.  It should insert a if
  // it doesn't already exist.
  EXPECT_TRUE(
      this->ht_.bracket_equal(this->UniqueKey(1), this->ht_.default_data()));
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());

  // bracket_assign is equivalent to ht_[a] = b.
  this->ht_.bracket_assign(this->UniqueKey(2),
                           this->ht_.get_data(this->UniqueObject(4)));
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(2)) != this->ht_.end());
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(4))));

  this->ht_.bracket_assign(this->UniqueKey(2),
                           this->ht_.get_data(this->UniqueObject(6)));
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(6))));
  // bracket_equal shouldn't have modified the value.
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(6))));

  // Verify that an operator[] that doesn't cause a resize, also
  // doesn't require an extra rehash.
  TypeParam ht(100);
  EXPECT_EQ(0, ht.hash_funct().num_hashes());
  ht.bracket_assign(this->UniqueKey(2), ht.get_data(this->UniqueObject(2)));
  EXPECT_EQ(1, ht.hash_funct().num_hashes());

  // And overwriting, likewise, should only cause one extra hash.
  ht.bracket_assign(this->UniqueKey(2), ht.get_data(this->UniqueObject(2)));
  EXPECT_EQ(2, ht.hash_funct().num_hashes());
}